

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidExpandDims2(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  Tensor *pTVar3;
  ostream *poVar4;
  Result local_b0;
  ExpandDimsLayerParams *params;
  NeuralNetworkLayer *l;
  NeuralNetwork *nn;
  ArrayFeatureType *shape_out;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,2);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  shape_out = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)shape_out,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)shape_out);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,1);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,1);
  l = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)l,EXACT_ARRAY_MAPPING);
  params = (ExpandDimsLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)params,"ED");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"B");
  pTVar3 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor((NeuralNetworkLayer *)params);
  CoreML::Specification::Tensor::set_rank(pTVar3,1);
  pTVar3 = CoreML::Specification::NeuralNetworkLayer::add_outputtensor((NeuralNetworkLayer *)params)
  ;
  CoreML::Specification::Tensor::set_rank(pTVar3,3);
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_expanddims((NeuralNetworkLayer *)params);
  CoreML::Specification::ExpandDimsLayerParams::add_axes
            ((ExpandDimsLayerParams *)local_b0.m_message._M_storage._M_storage,2);
  CoreML::Specification::ExpandDimsLayerParams::add_axes
            ((ExpandDimsLayerParams *)local_b0.m_message._M_storage._M_storage,-4);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_b0);
  if (m._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x131a);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidExpandDims2() {
    /*
     A -> expand dims -> B
     shape of A: (2)
     shape of B: (2, 1, 1)
     axes parameter = [2,-4]
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(2);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *shape_out = out->mutable_type()->mutable_multiarraytype();
    shape_out->add_shape(2);
    shape_out->add_shape(1);
    shape_out->add_shape(1);
    
    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l = nn->add_layers();
    l->set_name("ED");
    l->add_input("A");
    l->add_output("B");
    l->add_inputtensor()->set_rank(1);
    l->add_outputtensor()->set_rank(3);
    auto *params = l->mutable_expanddims();
    params->add_axes(2);
    params->add_axes(-4);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}